

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

char * __thiscall Corrade::Containers::String::release(String *this)

{
  char *pcVar1;
  ostream *output;
  char *data;
  Flags local_39;
  Error local_38;
  String *local_10;
  String *this_local;
  
  if (((this->field_0)._small.size & 0x40) != 0) {
    local_10 = this;
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_39);
    Utility::Error::Error(&local_38,output,local_39);
    Utility::Debug::operator<<
              (&local_38.super_Debug,"Containers::String::release(): cannot call on a SSO instance")
    ;
    Utility::Error::~Error(&local_38);
    abort();
  }
  pcVar1 = (this->field_0)._large.data;
  (this->field_0)._small.data[0] = '\0';
  (this->field_0)._small.size = '@';
  return pcVar1;
}

Assistant:

char* String::release() {
    /* Unlikely to be called very often, so a non-debug assert is fine */
    CORRADE_ASSERT(!(_small.size & Implementation::SmallStringBit),
        "Containers::String::release(): cannot call on a SSO instance", {});
    char* data = _large.data;

    /* Create a zero-size small string to fullfil the guarantee of data() being
       always non-null and null-terminated. Since this makes the string switch
       to SSO, we also clear the deleter this way. */
    _small.data[0] = '\0';
    _small.size = Implementation::SmallStringBit;
    return data;
}